

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O1

void __thiscall VFS::CVFS::CVFSFile::ReserveChunks(CVFSFile *this,size_t Count)

{
  SChunk *__p;
  char *pcVar1;
  shared_ptr<VFS::CVFS::CVFSFile::SChunk> local_38;
  
  std::
  vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
  ::reserve(&this->m_Data,Count);
  if (Count != 0) {
    do {
      __p = (SChunk *)operator_new(0x10);
      __p->Size = 0x1000;
      __p->Filled = 0;
      pcVar1 = (char *)operator_new__(0x1000);
      __p->Data = pcVar1;
      local_38.super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VFS::CVFS::CVFSFile::SChunk*>
                (&local_38.
                  super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,__p);
      std::
      vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>>>
      ::emplace_back<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>>
                ((vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>>>
                  *)&this->m_Data,&local_38);
      if (local_38.super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.
                   super___shared_ptr<VFS::CVFS::CVFSFile::SChunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      Count = Count - 1;
    } while (Count != 0);
  }
  return;
}

Assistant:

void ReserveChunks(size_t Count)
                    {
                        m_Data.reserve(Count);
                        for (size_t i = 0; i < Count; i++)
                            m_Data.push_back(Chunk(new SChunk()));
                    }